

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_7.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonschema::draft7::
schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::schema_validator_factory_7
          (schema_validator_factory_7<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *sch,
          validator_factory_factory_type *factory_factory,evaluation_options *options,
          schema_store_type *schema_store_ptr,
          vector<std::function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
          *resolve_funcs)

{
  string *version;
  string local_a0;
  evaluation_options local_80;
  
  schema_version::draft7_abi_cxx11_();
  evaluation_options::evaluation_options(&local_80,options);
  version = &local_a0;
  schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::schema_validator_factory_base
            (&this->
              super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             ,version,sch,factory_factory,&local_80,schema_store_ptr,resolve_funcs);
  evaluation_options::~evaluation_options(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  (this->
  super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  )._vptr_schema_validator_factory_base = (_func_int **)&PTR__schema_validator_factory_7_009a8eb8;
  (this->keyword_factory_map_)._M_h._M_buckets = &(this->keyword_factory_map_)._M_h._M_single_bucket
  ;
  (this->keyword_factory_map_)._M_h._M_bucket_count = 1;
  (this->keyword_factory_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->keyword_factory_map_)._M_h._M_element_count = 0;
  (this->keyword_factory_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->keyword_factory_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->keyword_factory_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->factory_).factory_ =
       &this->
        super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ;
  init(this,(EVP_PKEY_CTX *)version);
  return;
}

Assistant:

schema_validator_factory_7(Json&& sch, const validator_factory_factory_type& factory_factory, 
            evaluation_options options, schema_store_type* schema_store_ptr,
            const std::vector<resolve_uri_type<Json>>& resolve_funcs) 
            : schema_validator_factory_base<Json>(schema_version::draft7(), std::move(sch), factory_factory, options, schema_store_ptr, resolve_funcs),
              factory_(this)
        {
            init();
        }